

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

int png_colorspace_set_endpoints
              (png_const_structrp png_ptr,png_colorspacerp colorspace,png_XYZ *XYZ_in,int preferred)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  png_XYZ XYZ;
  png_xy xy;
  png_XYZ local_98;
  png_xy local_68;
  png_XYZ local_48;
  
  local_98.blue_Z = XYZ_in->blue_Z;
  local_98.red_X = XYZ_in->red_X;
  local_98.red_Y = XYZ_in->red_Y;
  local_98.red_Z = XYZ_in->red_Z;
  local_98.green_X = XYZ_in->green_X;
  local_98.green_Y = XYZ_in->green_Y;
  local_98.green_Z = XYZ_in->green_Z;
  local_98.blue_X = XYZ_in->blue_X;
  local_98.blue_Y = XYZ_in->blue_Y;
  if (((((((long)local_98._0_8_ < 0) || (local_98.green_Y < 0)) || ((long)local_98._24_8_ < 0)) ||
       ((local_98.red_X < 0 || ((long)local_98._8_8_ < 0)))) ||
      ((local_98.blue_X < 0 || ((local_98.red_Z < 0 || ((long)local_98._16_8_ < 0)))))) ||
     (((local_98.red_Y ^ 0x7fffffffU) < (uint)local_98.green_X || local_98.blue_Z < 0 ||
      ((local_98.green_Y + local_98.red_Y ^ 0x7fffffffU) < (uint)local_98.blue_X))))
  goto LAB_00276aa3;
  iVar3 = local_98.blue_Y + local_98.green_Y + local_98.red_Y;
  if (iVar3 != 100000) {
    iVar2 = png_muldiv(&local_98.red_X,local_98.red_X,100000,iVar3);
    if (iVar2 == 0) goto LAB_00276aa3;
    iVar2 = png_muldiv(&local_98.red_Y,local_98.red_Y,100000,iVar3);
    if (iVar2 == 0) goto LAB_00276aa3;
    iVar2 = png_muldiv(&local_98.red_Z,local_98.red_Z,100000,iVar3);
    if (iVar2 == 0) goto LAB_00276aa3;
    iVar2 = png_muldiv(&local_98.green_X,local_98.green_X,100000,iVar3);
    if (iVar2 == 0) goto LAB_00276aa3;
    iVar2 = png_muldiv(&local_98.green_Y,local_98.green_Y,100000,iVar3);
    if (iVar2 == 0) goto LAB_00276aa3;
    iVar2 = png_muldiv(&local_98.green_Z,local_98.green_Z,100000,iVar3);
    if (iVar2 == 0) goto LAB_00276aa3;
    iVar2 = png_muldiv(&local_98.blue_X,local_98.blue_X,100000,iVar3);
    if (iVar2 == 0) goto LAB_00276aa3;
    iVar2 = png_muldiv(&local_98.blue_Y,local_98.blue_Y,100000,iVar3);
    if ((iVar2 == 0) ||
       (iVar3 = png_muldiv(&local_98.blue_Z,local_98.blue_Z,100000,iVar3), iVar3 == 0))
    goto LAB_00276aa3;
  }
  iVar3 = png_xy_from_XYZ(&local_68,&local_98);
  if (iVar3 == 0) {
    local_48.blue_Z = local_98.blue_Z;
    local_48.green_Y = local_98.green_Y;
    local_48.green_Z = local_98.green_Z;
    local_48.blue_X = local_98.blue_X;
    local_48.blue_Y = local_98.blue_Y;
    local_48.red_X = local_98.red_X;
    local_48.red_Y = local_98.red_Y;
    local_48.red_Z = local_98.red_Z;
    local_48.green_X = local_98.green_X;
    iVar3 = png_colorspace_check_xy(&local_48,&local_68);
    if (iVar3 != 1) {
      if (iVar3 == 0) {
        iVar3 = png_colorspace_set_xy_and_XYZ(png_ptr,colorspace,&local_68,&local_98,preferred);
        return iVar3;
      }
      pbVar1 = (byte *)((long)&colorspace->flags + 1);
      *pbVar1 = *pbVar1 | 0x80;
      png_error(png_ptr,"internal error checking chromaticities");
    }
  }
LAB_00276aa3:
  pbVar1 = (byte *)((long)&colorspace->flags + 1);
  *pbVar1 = *pbVar1 | 0x80;
  png_benign_error(png_ptr,"invalid end points");
  return 0;
}

Assistant:

int /* PRIVATE */
png_colorspace_set_endpoints(png_const_structrp png_ptr,
    png_colorspacerp colorspace, const png_XYZ *XYZ_in, int preferred)
{
   png_XYZ XYZ = *XYZ_in;
   png_xy xy;

   switch (png_colorspace_check_XYZ(&xy, &XYZ))
   {
      case 0:
         return png_colorspace_set_xy_and_XYZ(png_ptr, colorspace, &xy, &XYZ,
             preferred);

      case 1:
         /* End points are invalid. */
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_benign_error(png_ptr, "invalid end points");
         break;

      default:
         colorspace->flags |= PNG_COLORSPACE_INVALID;
         png_error(png_ptr, "internal error checking chromaticities");
   }

   return 0; /* failed */
}